

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseMulExpr(Parser *this)

{
  long *plVar1;
  _Alloc_hider _Var2;
  Parser *in_RSI;
  TokenType op;
  _Alloc_hider local_40;
  undefined1 local_34 [4];
  _Alloc_hider local_30;
  
  parseUnaryExpr(this);
  while (local_34 = (undefined1  [4])(in_RSI->m_currToken).type,
        ((uint)local_34 & ~LeftBrace) == Star) {
    eatToken(in_RSI,(TokenType)local_34);
    parseUnaryExpr((Parser *)&stack0xffffffffffffffd0);
    std::
    make_unique<AST::BinaryExpr,TokenType&,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)&local_40,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_34,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)this);
    _Var2._M_p = local_40._M_p;
    local_40._M_p = (pointer)0x0;
    plVar1 = (long *)(this->m_lexer).m_input._M_dataplus._M_p;
    (this->m_lexer).m_input._M_dataplus._M_p = _Var2._M_p;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      if ((long *)local_40._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_40._M_p + 8))();
      }
    }
    if ((long *)local_30._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_p + 8))();
    }
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseMulExpr() {
    auto expr = parseUnaryExpr();
    while (m_currToken.type == TokenType::Star || m_currToken.type == TokenType::Slash) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto right = parseUnaryExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}